

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O0

void __thiscall QGroupBoxPrivate::calculateFrame(QGroupBoxPrivate *this)

{
  int top;
  int left;
  int iVar1;
  int iVar2;
  QGroupBox *pQVar3;
  QStyle *pQVar4;
  QGroupBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QGroupBox *q;
  QRect contentsRect;
  QStyleOptionGroupBox box;
  QWidget *this_00;
  QStyleOptionGroupBox *this_01;
  QWidget *this_02;
  undefined4 in_stack_ffffffffffffff08;
  SubElement element;
  undefined4 in_stack_ffffffffffffff18;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  QWidgetData *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func(in_RDI);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = (QStyleOptionGroupBox *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  this_02 = (QWidget *)&local_88;
  QStyleOptionGroupBox::QStyleOptionGroupBox((QStyleOptionGroupBox *)0x5a3eb1);
  (**(code **)(*(long *)&pQVar3->super_QWidget + 0x1a0))(pQVar3,&local_98);
  local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = QWidget::style(this_00);
  local_a8 = (**(code **)(*(long *)pQVar4 + 0xd8))(pQVar4,7,&local_98,4,pQVar3);
  element = (SubElement)((ulong)local_a8 >> 0x20);
  top = QRect::left((QRect *)0x5a3f23);
  QRect::left((QRect *)0x5a3f31);
  left = QRect::top((QRect *)0x5a3f47);
  QRect::top((QRect *)0x5a3f55);
  iVar1 = QRect::right((QRect *)0x5a3f6b);
  QRect::right((QRect *)0x5a3f79);
  iVar2 = QRect::bottom((QRect *)0x5a3f8f);
  QRect::bottom((QRect *)0x5a3f9d);
  QWidget::setContentsMargins(this_02,left,top,(int)((ulong)this_01 >> 0x20),(int)this_01);
  QWidgetPrivate::setLayoutItemMargins
            ((QWidgetPrivate *)CONCAT44(iVar2,in_stack_ffffffffffffff18),element,
             (QStyleOption *)CONCAT44(iVar1,in_stack_ffffffffffffff08));
  QStyleOptionGroupBox::~QStyleOptionGroupBox(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGroupBoxPrivate::calculateFrame()
{
    Q_Q(QGroupBox);
    QStyleOptionGroupBox box;
    q->initStyleOption(&box);
    QRect contentsRect = q->style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxContents, q);
    q->setContentsMargins(contentsRect.left() - box.rect.left(), contentsRect.top() - box.rect.top(),
                          box.rect.right() - contentsRect.right(), box.rect.bottom() - contentsRect.bottom());
    setLayoutItemMargins(QStyle::SE_GroupBoxLayoutItem, &box);
}